

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

ecs_iter_t *
ecs_query_iter_page(ecs_iter_t *__return_storage_ptr__,ecs_query_t *query,int32_t offset,
                   int32_t limit)

{
  uint uVar1;
  ecs_world_t *world;
  ecs_table_t *table;
  uint uVar2;
  int32_t iVar3;
  void *pvVar4;
  int32_t *piVar5;
  long lVar6;
  long lVar7;
  ecs_vector_t *vector;
  ulong uVar8;
  
  _ecs_assert(query != (ecs_query_t *)0x0,2,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x923);
  if (query == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x923,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
  }
  _ecs_assert((query->flags >> 9 & 1) == 0,2,(char *)0x0,"!(query->flags & EcsQueryIsOrphaned)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x924);
  if ((query->flags & 0x200) != 0) {
    __assert_fail("!(query->flags & (512))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x924,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
  }
  world = query->world;
  if (query->needs_reorder == true) {
    order_ranked_tables(world,query);
  }
  sort_tables(world,query);
  if ((world->in_progress == false) && ((query->flags & 0x40) != 0)) {
    ecs_eval_component_monitors(world);
  }
  query->prev_match_count = query->match_count;
  uVar2 = ecs_vector_count(query->tables);
  pvVar4 = _ecs_vector_first(query->tables,0x50,0x10);
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      lVar6 = uVar8 * 0x50;
      if (*(long *)((long)pvVar4 + lVar6 + 0x40) == 0) break;
      table = *(ecs_table_t **)((long)pvVar4 + lVar6 + 8);
      piVar5 = ecs_table_get_dirty_state(table);
      uVar1 = table->column_count;
      if (-1 < (int)uVar1) {
        lVar6 = *(long *)((long)pvVar4 + lVar6 + 0x40);
        lVar7 = 0;
        do {
          *(int32_t *)(lVar6 + lVar7 * 4) = piVar5[lVar7];
          lVar7 = lVar7 + 1;
        } while ((ulong)uVar1 + 1 != lVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  vector = query->table_slices;
  if (vector == (ecs_vector_t *)0x0) {
    vector = query->tables;
  }
  iVar3 = ecs_vector_count(vector);
  memset(&__return_storage_ptr__->real_world,0,0xd8);
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->query = query;
  __return_storage_ptr__->table_count = iVar3;
  iVar3 = ecs_vector_count(query->empty_tables);
  __return_storage_ptr__->inactive_table_count = iVar3;
  iVar3 = ecs_vector_count((query->sig).columns);
  __return_storage_ptr__->column_count = iVar3;
  (__return_storage_ptr__->iter).query.page_iter.offset = offset;
  (__return_storage_ptr__->iter).query.page_iter.limit = limit;
  (__return_storage_ptr__->iter).query.page_iter.remaining = limit;
  *(undefined8 *)((long)&(__return_storage_ptr__->iter).parent.filter.exclude + 4) = 0;
  *(undefined8 *)&(__return_storage_ptr__->iter).parent.filter.exclude_kind = 0;
  return __return_storage_ptr__;
}

Assistant:

ecs_iter_t ecs_query_iter_page(
    ecs_query_t *query,
    int32_t offset,
    int32_t limit)
{
    ecs_assert(query != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!(query->flags & EcsQueryIsOrphaned), ECS_INVALID_PARAMETER, NULL);

    ecs_world_t *world = query->world;

    if (query->needs_reorder) {
        order_ranked_tables(world, query);
    }
    
    sort_tables(world, query);

    if (!world->in_progress && query->flags & EcsQueryHasRefs) {
        ecs_eval_component_monitors(world);
    }

    tables_reset_dirty(query);

    int32_t table_count;
    if (query->table_slices) {
        table_count = ecs_vector_count(query->table_slices);
    } else {
        table_count = ecs_vector_count(query->tables);
    }

    ecs_query_iter_t it = {
        .page_iter = {
            .offset = offset,
            .limit = limit,
            .remaining = limit
        },
        .index = 0,
    };

    return (ecs_iter_t){
        .world = world,
        .query = query,
        .column_count = ecs_vector_count(query->sig.columns),
        .table_count = table_count,
        .inactive_table_count = ecs_vector_count(query->empty_tables),
        .iter.query = it
    };
}